

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InstrumentPass::GenStageInfo
          (InstrumentPass *this,uint32_t stage_idx,InstructionBuilder *builder)

{
  InstrumentPass *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  Instruction *this_01;
  uint32_t u;
  long lVar4;
  InstructionBuilder *pIVar5;
  IRContext *this_02;
  undefined4 local_7c;
  InstrumentPass *local_78;
  InstructionBuilder *local_70;
  uint32_t local_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  
  local_78 = this;
  local_68[0] = InstructionBuilder::GetUintConstantId(builder,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&ids,4,local_68,(allocator_type *)&local_7c);
  local_70 = builder;
  uVar1 = InstructionBuilder::GetUintConstantId(builder,stage_idx);
  this_00 = local_78;
  *ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = uVar1;
  switch(stage_idx) {
  case 0:
    uVar1 = IRContext::GetBuiltinInputVarId((local_78->super_Pass).context_,0x2a);
    pIVar5 = local_70;
    uVar1 = GenVarLoad(this_00,uVar1,local_70);
    uVar1 = GenUintCastCode(this_00,uVar1,pIVar5);
    ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[1] = uVar1;
    this_02 = (this_00->super_Pass).context_;
    uVar1 = 0x2b;
    break;
  case 1:
    uVar1 = IRContext::GetBuiltinInputVarId((local_78->super_Pass).context_,8);
    pIVar5 = local_70;
    uVar1 = GenVarLoad(this_00,uVar1,local_70);
    uVar1 = GenUintCastCode(this_00,uVar1,pIVar5);
    ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[1] = uVar1;
    uVar1 = IRContext::GetBuiltinInputVarId((this_00->super_Pass).context_,7);
    uVar1 = GenVarLoad(this_00,uVar1,pIVar5);
    goto LAB_001fb200;
  case 2:
    uVar1 = IRContext::GetBuiltinInputVarId((local_78->super_Pass).context_,7);
    pIVar5 = local_70;
    uVar1 = GenVarLoad(this_00,uVar1,local_70);
    ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[1] = uVar1;
    uVar1 = IRContext::GetBuiltinInputVarId((this_00->super_Pass).context_,0xd);
    uVar1 = GenVarLoad(this_00,uVar1,pIVar5);
    uVar2 = GetVec3UintId(this_00);
    pIVar3 = InstructionBuilder::AddUnaryOp(pIVar5,uVar2,OpBitcast,uVar1);
    uVar1 = Instruction::result_id(pIVar3);
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      uVar2 = GetUintId(local_78);
      local_7c = (undefined4)lVar4;
      local_68[0] = 0;
      local_68[1] = 0;
      local_68[2] = 0;
      local_68[3] = 0;
      local_68[4] = 0;
      local_68[5] = 0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_68,&local_7c,&local_78);
      pIVar3 = InstructionBuilder::AddCompositeExtract
                         (local_70,uVar2,uVar1,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      uVar2 = Instruction::result_id(pIVar3);
      ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4 + 2] = uVar2;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    }
    goto LAB_001fb208;
  case 3:
    uVar1 = IRContext::GetBuiltinInputVarId((local_78->super_Pass).context_,7);
    pIVar5 = local_70;
    uVar1 = GenVarLoad(this_00,uVar1,local_70);
    ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[1] = uVar1;
    this_02 = (this_00->super_Pass).context_;
    uVar1 = 8;
    break;
  case 4:
    uVar1 = GetVec4FloatId(local_78);
    uVar2 = IRContext::GetBuiltinInputVarId((this_00->super_Pass).context_,0xf);
    pIVar5 = local_70;
    pIVar3 = InstructionBuilder::AddLoad(local_70,uVar1,uVar2,0);
    uVar1 = GetVec4UintId(this_00);
    uVar2 = Instruction::result_id(pIVar3);
    pIVar3 = InstructionBuilder::AddUnaryOp(pIVar5,uVar1,OpBitcast,uVar2);
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      uVar1 = GetUintId(local_78);
      uVar2 = Instruction::result_id(pIVar3);
      local_7c = (undefined4)lVar4;
      local_68[0] = 0;
      local_68[1] = 0;
      local_68[2] = 0;
      local_68[3] = 0;
      local_68[4] = 0;
      local_68[5] = 0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_68,&local_7c,&local_78);
      this_01 = InstructionBuilder::AddCompositeExtract
                          (local_70,uVar1,uVar2,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      uVar1 = Instruction::result_id(this_01);
      ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4 + 1] = uVar1;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    }
    goto LAB_001fb208;
  case 5:
    goto switchD_001fb060_caseD_5;
  default:
    if (stage_idx - 0x14c1 < 6) {
      uVar1 = IRContext::GetBuiltinInputVarId((local_78->super_Pass).context_,0x14c7);
      uVar1 = GenVarLoad(this_00,uVar1,local_70);
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        uVar2 = GetUintId(local_78);
        local_7c = (undefined4)lVar4;
        local_68[0] = 0;
        local_68[1] = 0;
        local_68[2] = 0;
        local_68[3] = 0;
        local_68[4] = 0;
        local_68[5] = 0;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_initialize<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_68,&local_7c,&local_78
                  );
        pIVar3 = InstructionBuilder::AddCompositeExtract
                           (local_70,uVar2,uVar1,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
        uVar2 = Instruction::result_id(pIVar3);
        ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4 + 1] = uVar2;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      }
      goto LAB_001fb208;
    }
    if ((1 < stage_idx - 0x1493) && (1 < stage_idx - 0x14f4)) {
      __assert_fail("false && \"unsupported stage\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                    ,0x115,
                    "uint32_t spvtools::opt::InstrumentPass::GenStageInfo(uint32_t, InstructionBuilder *)"
                   );
    }
    goto switchD_001fb060_caseD_5;
  }
  uVar1 = IRContext::GetBuiltinInputVarId(this_02,uVar1);
  uVar1 = GenVarLoad(this_00,uVar1,pIVar5);
  uVar1 = GenUintCastCode(this_00,uVar1,pIVar5);
LAB_001fb200:
  ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[2] = uVar1;
LAB_001fb208:
  uVar1 = GetVec4UintId(local_78);
  pIVar3 = InstructionBuilder::AddCompositeConstruct
                     (local_70,uVar1,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  uVar1 = Instruction::result_id(pIVar3);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return uVar1;
switchD_001fb060_caseD_5:
  uVar1 = IRContext::GetBuiltinInputVarId((local_78->super_Pass).context_,0x1c);
  uVar1 = GenVarLoad(this_00,uVar1,local_70);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    uVar2 = GetUintId(local_78);
    local_7c = (undefined4)lVar4;
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_68,&local_7c,&local_78);
    pIVar3 = InstructionBuilder::AddCompositeExtract
                       (local_70,uVar2,uVar1,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    uVar2 = Instruction::result_id(pIVar3);
    ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4 + 1] = uVar2;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  }
  goto LAB_001fb208;
}

Assistant:

uint32_t InstrumentPass::GenStageInfo(uint32_t stage_idx,
                                      InstructionBuilder* builder) {
  std::vector<uint32_t> ids(4, builder->GetUintConstantId(0));
  ids[0] = builder->GetUintConstantId(stage_idx);
  // %289 = OpCompositeConstruct %v4uint %uint_0 %285 %288 %uint_0
  // TODO(greg-lunarg): Add support for all stages
  switch (spv::ExecutionModel(stage_idx)) {
    case spv::ExecutionModel::Vertex: {
      // Load and store VertexId and InstanceId
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::VertexIndex)),
          builder);
      ids[1] = GenUintCastCode(load_id, builder);

      load_id = GenVarLoad(context()->GetBuiltinInputVarId(
                               uint32_t(spv::BuiltIn::InstanceIndex)),
                           builder);
      ids[2] = GenUintCastCode(load_id, builder);
    } break;
    case spv::ExecutionModel::GLCompute:
    case spv::ExecutionModel::TaskNV:
    case spv::ExecutionModel::MeshNV:
    case spv::ExecutionModel::TaskEXT:
    case spv::ExecutionModel::MeshEXT: {
      // Load and store GlobalInvocationId.
      uint32_t load_id = GenVarLoad(context()->GetBuiltinInputVarId(uint32_t(
                                        spv::BuiltIn::GlobalInvocationId)),
                                    builder);
      for (uint32_t u = 0; u < 3u; ++u) {
        ids[u + 1] = builder->AddCompositeExtract(GetUintId(), load_id, {u})
                         ->result_id();
      }
    } break;
    case spv::ExecutionModel::Geometry: {
      // Load and store PrimitiveId and InvocationId.
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::PrimitiveId)),
          builder);
      ids[1] = load_id;
      load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::InvocationId)),
          builder);
      ids[2] = GenUintCastCode(load_id, builder);
    } break;
    case spv::ExecutionModel::TessellationControl: {
      // Load and store InvocationId and PrimitiveId
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::InvocationId)),
          builder);
      ids[1] = GenUintCastCode(load_id, builder);
      load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::PrimitiveId)),
          builder);
      ids[2] = load_id;
    } break;
    case spv::ExecutionModel::TessellationEvaluation: {
      // Load and store PrimitiveId and TessCoord.uv
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::PrimitiveId)),
          builder);
      ids[1] = load_id;
      load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::TessCoord)),
          builder);
      Instruction* uvec3_cast_inst =
          builder->AddUnaryOp(GetVec3UintId(), spv::Op::OpBitcast, load_id);
      uint32_t uvec3_cast_id = uvec3_cast_inst->result_id();
      for (uint32_t u = 0; u < 2u; ++u) {
        ids[u + 2] =
            builder->AddCompositeExtract(GetUintId(), uvec3_cast_id, {u})
                ->result_id();
      }
    } break;
    case spv::ExecutionModel::Fragment: {
      // Load FragCoord and convert to Uint
      Instruction* frag_coord_inst = builder->AddLoad(
          GetVec4FloatId(),
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::FragCoord)));
      Instruction* uint_frag_coord_inst = builder->AddUnaryOp(
          GetVec4UintId(), spv::Op::OpBitcast, frag_coord_inst->result_id());
      for (uint32_t u = 0; u < 2u; ++u) {
        ids[u + 1] =
            builder
                ->AddCompositeExtract(GetUintId(),
                                      uint_frag_coord_inst->result_id(), {u})
                ->result_id();
      }
    } break;
    case spv::ExecutionModel::RayGenerationNV:
    case spv::ExecutionModel::IntersectionNV:
    case spv::ExecutionModel::AnyHitNV:
    case spv::ExecutionModel::ClosestHitNV:
    case spv::ExecutionModel::MissNV:
    case spv::ExecutionModel::CallableNV: {
      // Load and store LaunchIdNV.
      uint32_t launch_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::LaunchIdNV)),
          builder);
      for (uint32_t u = 0; u < 3u; ++u) {
        ids[u + 1] = builder->AddCompositeExtract(GetUintId(), launch_id, {u})
                         ->result_id();
      }
    } break;
    default: { assert(false && "unsupported stage"); } break;
  }
  return builder->AddCompositeConstruct(GetVec4UintId(), ids)->result_id();
}